

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest02ValidityPeriods_::
Section2ValidGeneralizedTimenotBeforeDateTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section2ValidGeneralizedTimenotBeforeDateTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  undefined1 local_b8 [8];
  PkitsTestInfo info;
  char *crls [2];
  char *certs [3];
  Section2ValidGeneralizedTimenotBeforeDateTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  crls[1] = "TrustAnchorRootCertificate";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  crls[0] = "GoodCACRL";
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_b8);
  local_b8 = (undefined1  [8])0x6f389f;
  info.time.year._0_1_ = 1;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)this,
             (char *(*) [3])(crls + 1),
             (char *(*) [2])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_b8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_b8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest02ValidityPeriods,
                     Section2ValidGeneralizedTimenotBeforeDateTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "ValidGeneralizedTimenotBeforeDateTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.2.4";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}